

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O0

int AF_A_AlertMonsters(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  AActor *pAVar1;
  AActor *pAVar2;
  bool bVar3;
  bool local_6e;
  bool local_6b;
  AActor *local_68;
  AActor *emitter;
  AActor *target;
  double dStack_50;
  int Flags;
  double maxdist;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0x95,"int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    local_68 = (AActor *)(param->field_0).field_1.a;
    local_6b = true;
    if (local_68 != (AActor *)0x0) {
      local_6b = DObject::IsKindOf((DObject *)local_68,AActor::RegistrationInfo.MyClass);
    }
    if (local_6b == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                    ,0x95,"int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
        bVar3 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                      ,0x95,
                      "int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      this = (DObject *)param[1].field_0.field_1.a;
      local_6e = true;
      if (this != (DObject *)0x0) {
        local_6e = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
      }
      if (local_6e == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                      ,0x95,
                      "int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, param[2].field_0.field_1.atag != 8)) {
        bVar3 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                      ,0x95,
                      "int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
      dStack_50 = 0.0;
    }
    else {
      if (param[3].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                      ,0x96,
                      "int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      dStack_50 = param[3].field_0.f;
    }
    if ((numparam < 5) || (param[4].field_0.field_3.Type == 0xff)) {
      target._4_4_ = 0;
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                      ,0x97,
                      "int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      target._4_4_ = param[4].field_0.i;
    }
    emitter = (AActor *)0x0;
    pAVar2 = local_68;
    if ((local_68->player == (player_t *)0x0) && (pAVar2 = local_68, (target._4_4_ & 1) == 0)) {
      bVar3 = TObjPtr<AActor>::operator!=(&local_68->target,(AActor *)0x0);
      if ((bVar3) && ((target._4_4_ & 2) != 0)) {
        pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_68->target);
      }
      else {
        bVar3 = TObjPtr<AActor>::operator!=(&local_68->target,(AActor *)0x0);
        pAVar2 = emitter;
        if ((bVar3) &&
           (pAVar1 = TObjPtr<AActor>::operator->(&local_68->target),
           pAVar1->player != (player_t *)0x0)) {
          pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_68->target);
        }
      }
    }
    emitter = pAVar2;
    if ((target._4_4_ & 4) != 0) {
      local_68 = emitter;
    }
    if ((emitter != (AActor *)0x0) && (local_68 != (AActor *)0x0)) {
      P_NoiseAlert(emitter,local_68,false,dStack_50);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x95,"int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_AlertMonsters)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_FLOAT_OPT(maxdist) { maxdist = 0; }
	PARAM_INT_OPT(Flags) { Flags = 0; }

	AActor * target = NULL;
	AActor * emitter = self;

	if (self->player != NULL || (Flags & AMF_TARGETEMITTER))
	{
		target = self;
	}
	else if (self->target != NULL && (Flags & AMF_TARGETNONPLAYER))
	{
		target = self->target;
	}
	else if (self->target != NULL && self->target->player != NULL)
	{
		target = self->target;
	}

	if (Flags & AMF_EMITFROMTARGET) emitter = target;

	if (target != NULL && emitter != NULL)
	{
		P_NoiseAlert(target, emitter, false, maxdist);
	}
	return 0;
}